

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::Desc(Desc *this)

{
  Real in_RDI;
  Real p_fac;
  int in_stack_ffffffffffffffd8;
  int p_size;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *this_00;
  
  p_size = 0;
  this_00 = (DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
             *)0x3ff3333333333333;
  p_fac = in_RDI;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::DataArray((DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
               *)0x3ff3333333333333,0,in_stack_ffffffffffffffd8,in_RDI);
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::DataArray(this_00,p_size,in_stack_ffffffffffffffd8,p_fac);
  *(undefined8 *)((long)in_RDI + 0x30) = 0;
  *(undefined8 *)((long)in_RDI + 0x38) = 0;
  return;
}

Assistant:

Desc()
         : stat(nullptr)
         , costat(nullptr)
      {}